

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O0

void pzgeom::TPZQuadraticLine::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  long lVar6;
  int64_t iVar7;
  long *plVar8;
  TPZGeoEl *pTVar9;
  TPZVec<double> *in_RCX;
  TPZVec<double> *in_RDX;
  uint in_ESI;
  TPZGeoMesh *in_RDI;
  int i_2;
  TPZGeoNode *nodeptr;
  int is;
  int nsides;
  TPZGeoEl *gel;
  int64_t index;
  int j;
  int i_1;
  int i;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  TPZManVector<double,_3> co;
  int64_t in_stack_fffffffffffffd88;
  TPZGeoMesh *in_stack_fffffffffffffd90;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffd98;
  TPZGeoEl *in_stack_fffffffffffffda0;
  int64_t in_stack_fffffffffffffda8;
  TPZChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffdb0;
  int64_t in_stack_fffffffffffffdb8;
  TPZManVector<double,_3> *in_stack_fffffffffffffdc0;
  int local_144;
  int local_138;
  undefined1 local_128 [12];
  int local_11c;
  int local_118;
  int local_114;
  TPZVec<long> local_110;
  TPZVec<double> local_d8 [2];
  TPZVec<double> local_90;
  _func_int **in_stack_ffffffffffffffa8;
  TPZGeoMesh *in_stack_ffffffffffffffb0;
  
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  TPZManVector<long,_3>::TPZManVector
            ((TPZManVector<long,_3> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  for (local_114 = 0; local_114 < 3; local_114 = local_114 + 1) {
    pdVar5 = TPZVec<double>::operator[](in_RCX,(long)local_114);
    dVar1 = *pdVar5;
    pdVar5 = TPZVec<double>::operator[](local_d8,(long)local_114);
    *pdVar5 = dVar1 / 3.0;
    pdVar5 = TPZVec<double>::operator[](in_RDX,(long)local_114);
    dVar1 = *pdVar5;
    pdVar5 = TPZVec<double>::operator[](&local_90,(long)local_114);
    *pdVar5 = dVar1 + 0.5;
  }
  for (local_118 = 0; local_118 < 2; local_118 = local_118 + 1) {
    pztopology::TPZLine::ParametricDomainNodeCoord
              ((int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
               (TPZVec<double> *)in_stack_fffffffffffffd98);
    local_11c = 0;
    while( true ) {
      lVar6 = (long)local_11c;
      iVar7 = TPZVec<double>::size((TPZVec<double> *)&stack0xffffffffffffffa8);
      if (iVar7 <= lVar6) break;
      pdVar5 = TPZVec<double>::operator[](&local_90,(long)local_11c);
      dVar1 = *pdVar5;
      pdVar5 = TPZVec<double>::operator[](local_d8,(long)local_11c);
      dVar2 = *pdVar5;
      pdVar5 = TPZVec<double>::operator[]
                         ((TPZVec<double> *)&stack0xffffffffffffffa8,(long)local_11c);
      dVar3 = *pdVar5;
      iVar4 = rand();
      pdVar5 = TPZVec<double>::operator[]
                         ((TPZVec<double> *)&stack0xffffffffffffffa8,(long)local_11c);
      *pdVar5 = dVar2 * dVar3 + dVar1 + ((double)iVar4 * 0.2) / 2147483647.0 + -0.1;
      local_11c = local_11c + 1;
    }
    TPZManVector<double,_3>::Resize(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    for (; local_11c < 3; local_11c = local_11c + 1) {
      pdVar5 = TPZVec<double>::operator[](&local_90,(long)local_11c);
      dVar1 = *pdVar5;
      iVar4 = rand();
      pdVar5 = TPZVec<double>::operator[]
                         ((TPZVec<double> *)&stack0xffffffffffffffa8,(long)local_11c);
      *pdVar5 = dVar1 + ((double)iVar4 * 0.2) / 2147483647.0 + -0.1;
    }
    TPZGeoMesh::NodeVec(in_RDI);
    iVar4 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(in_stack_fffffffffffffd98);
    plVar8 = TPZVec<long>::operator[](&local_110,(long)local_118);
    *plVar8 = (long)iVar4;
    TPZGeoMesh::NodeVec(in_RDI);
    TPZVec<long>::operator[](&local_110,(long)local_118);
    TPZChunkVector<TPZGeoNode,_10>::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    TPZGeoNode::Initialize
              ((TPZGeoNode *)in_stack_fffffffffffffda0,(TPZVec<double> *)in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
  }
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xc])(in_RDI,1,&local_110,(ulong)in_ESI,local_128);
  pTVar9 = TPZGeoMesh::Element(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  iVar4 = (**(code **)(*(long *)pTVar9 + 0xf0))();
  for (local_138 = 0; local_138 < iVar4; local_138 = local_138 + 1) {
    (**(code **)(*(long *)pTVar9 + 0x180))(pTVar9,local_138);
  }
  TPZChangeEl::ChangeToQuadratic(in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8);
  TPZGeoEl::NodePtr(in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  for (local_144 = 0; local_144 < 3; local_144 = local_144 + 1) {
    pdVar5 = TPZVec<double>::operator[](in_RDX,(long)local_144);
    in_stack_fffffffffffffda0 = (TPZGeoEl *)*pdVar5;
    pdVar5 = TPZVec<double>::operator[](in_RCX,(long)local_144);
    in_stack_fffffffffffffd90 = (TPZGeoMesh *)((double)in_stack_fffffffffffffda0 + *pdVar5 * 0.5);
    in_stack_fffffffffffffd98 =
         (TPZAdmChunkVector<TPZGeoNode,_10> *)
         TPZVec<double>::operator[]((TPZVec<double> *)&stack0xffffffffffffffa8,(long)local_144);
    (in_stack_fffffffffffffd98->super_TPZChunkVector<TPZGeoNode,_10>).super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)in_stack_fffffffffffffd90;
  }
  TPZGeoEl::NodePtr(in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  TPZGeoNode::SetCoord
            ((TPZGeoNode *)in_stack_fffffffffffffda0,(TPZVec<double> *)in_stack_fffffffffffffd98);
  TPZManVector<long,_3>::~TPZManVector((TPZManVector<long,_3> *)in_stack_fffffffffffffd90);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd90);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd90);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffffd90);
  return;
}

Assistant:

void TPZQuadraticLine::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    TPZManVector<REAL,3> co(3),shift(3),scale(3);
    TPZManVector<int64_t,3> nodeindexes(2);
    for (int i=0; i<3; i++) {
        scale[i] = size[i]/3.;
        shift[i] = 1./2.+lowercorner[i];
    }
    
    for (int i=0; i<NCornerNodes; i++) {
        ParametricDomainNodeCoord(i, co);
        int j;
        for (j=0; j<co.size(); j++) {
            co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        co.Resize(3);
        for (; j<3; j++) {
            co[j] = shift[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
    }
    int64_t index;
    gmesh.CreateGeoElement(EOned, nodeindexes, matid, index);
    TPZGeoEl *gel = gmesh.Element(index);
    int nsides = gel->NSides();
    for (int is = 0; is<nsides; is++) {
        gel->SetSideDefined(is);
    }
    
    gel = TPZChangeEl::ChangeToQuadratic(&gmesh,index);
    TPZGeoNode *nodeptr = gel->NodePtr(2);
    for (int i=0; i<3; i++) {
        co[i] = lowercorner[i]+size[i]/2.;
    }
    gel->NodePtr(2)->SetCoord(co);
}